

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O3

toktldef *
prsvlst(prscxdef *ctx,toktldef *lcltab,prsndef **inits,int *locals,int args,int *varargs,uint curfr)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  lindef *lin;
  int iVar4;
  uchar *__dest;
  prsndef *ppVar5;
  prsndef *ppVar6;
  prsndef *n2;
  tokcxdef *ptVar7;
  tokdef t2;
  tokdef local_a0;
  
  toknext(ctx->prscxtok);
  if (lcltab == (toktldef *)0x0) {
    if (ctx->prscxslcl < 0x5c) {
      errsigf(ctx->prscxerr,"TADS",0x144);
    }
    lcltab = (toktldef *)((ulong)(ctx->prscxplcl + 7) & 0xfffffffffffffff8);
    toktlini(ctx->prscxerr,lcltab,(uchar *)(lcltab + 1),ctx->prscxslcl - 0x48);
    (lcltab->toktlsc).toktnxt = ctx->prscxtok->tokcxstab;
    ctx->prscxtok->tokcxstab = (toktdef *)lcltab;
  }
  ptVar7 = ctx->prscxtok;
  if ((ptVar7->tokcxcur).toktyp == 0x38) {
    do {
      uVar3 = *locals;
      uVar1 = uVar3 + 1;
      *locals = uVar1;
      ptVar7 = ctx->prscxtok;
      uVar3 = ~uVar3;
      if (args == 0) {
        uVar3 = uVar1;
      }
      (*(lcltab->toktlsc).toktfadd)
                (&lcltab->toktlsc,(ptVar7->tokcxcur).toknam,(ptVar7->tokcxcur).toklen,4,uVar3,
                 (ptVar7->tokcxcur).tokhash);
      iVar4 = toknext(ctx->prscxtok);
      if ((inits != (prsndef **)0x0) && (iVar4 == 0x9e || iVar4 == 7)) {
        toknext(ctx->prscxtok);
        if (((ctx->prscxflg & 1) == 0) || (lin = ctx->prscxtok->tokcxlin, (lin->linflg & 4) != 0)) {
          ppVar5 = prsxini(ctx);
          ppVar6 = prsnew0(ctx,&ptVar7->tokcxcur);
          ppVar5 = prsnew3(ctx,0x48,ppVar5,ppVar6,*inits);
        }
        else {
          uVar2 = ctx->prscxemt->emtcxofs;
          prsclin(ctx,curfr,lin,0,(uchar *)0x0);
          __dest = prsbalo(ctx,(uint)ctx->prscxemt->emtcxofs - (uint)uVar2);
          memcpy(__dest,ctx->prscxemt->emtcxptr + uVar2,
                 (ulong)((uint)ctx->prscxemt->emtcxofs - (uint)uVar2));
          ctx->prscxemt->emtcxofs = uVar2;
          local_a0.tokofs = (short)__dest - ((short)ctx + 0xd0);
          ppVar5 = prsnew0(ctx,&local_a0);
          ppVar6 = prsxini(ctx);
          n2 = prsnew0(ctx,&ptVar7->tokcxcur);
          ppVar5 = prsnew4(ctx,0x48,ppVar6,n2,*inits,ppVar5);
        }
        *inits = ppVar5;
        *(long *)((long)&(ppVar5->prsnv).prsnvn[1]->prsnv + 8) = (long)*locals;
      }
      ptVar7 = ctx->prscxtok;
      if ((ptVar7->tokcxcur).toktyp != 0x3f) break;
      toknext(ptVar7);
      ptVar7 = ctx->prscxtok;
    } while ((ptVar7->tokcxcur).toktyp == 0x38);
  }
  if ((varargs != (int *)0x0) && ((ptVar7->tokcxcur).toktyp == 0xcc)) {
    *varargs = 1;
    toknext(ctx->prscxtok);
  }
  ctx->prscxplcl = lcltab->toktlnxt;
  ctx->prscxslcl = (ushort)lcltab->toktlsiz;
  return lcltab;
}

Assistant:

static toktldef *prsvlst(prscxdef *ctx, toktldef *lcltab, prsndef **inits,
                         int *locals, int args, int *varargs, uint curfr)
{
    tokdef   *t;

    /* skip whatever token encouraged caller to parse a variable list */
    toknext(ctx->prscxtok);
    
    /* if caller doesn't already have a local table, allocate one now */
    if (!lcltab)
    {
        /* ensure there's enough space */
        if (ctx->prscxslcl < sizeof(toktldef) + 20)
            errsig(ctx->prscxerr, ERR_NOMEMLC);
        
        /* set up space for linear table and initialize it */
        lcltab = (toktldef *)osrndpt(ctx->prscxplcl);
        toktlini(ctx->prscxerr, lcltab, (uchar *)(lcltab + 1),
                 (int)ctx->prscxslcl - (uint)sizeof(toktldef));
        
        /* make new local symbol table the head of search list */
        lcltab->toktlsc.toktnxt = ctx->prscxtok->tokcxstab;
        ctx->prscxtok->tokcxstab = &lcltab->toktlsc;
    }

    for (;;)
    {
        int tnum;
        
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTSYMBOL) break;
        
        /* add the symbol */
        ++(*locals);
        t = &ctx->prscxtok->tokcxcur;
        (*lcltab->toktlsc.toktfadd)((toktdef *)lcltab, t->toknam, t->toklen,
                                    TOKSTLOCAL, (args ? -(*locals) : *locals),
                                    t->tokhash);
            
        /* check for initializer if initializers are ok */
        if (((tnum = toknext(ctx->prscxtok)) == TOKTASSIGN || tnum == TOKTEQ)
            && inits)
        {
            prsndef *expr;

            toknext(ctx->prscxtok);                          /* skip the := */
            
            /* save the OPCLINE if necessary */
            if ((ctx->prscxflg & PRSCXFLIN)
                && !(ctx->prscxtok->tokcxlin->linflg & LINFDBG))
            {
                uint     oldofs = ctx->prscxemt->emtcxofs;       /* save PC */
                uchar   *linrec;
                prsndef *n4;
                tokdef   t2;
                uint     siz;

                /* gen the OPCLINE, and copy into temp storage in tree */
                prsclin(ctx, curfr, ctx->prscxtok->tokcxlin, FALSE, 0);
                siz = ctx->prscxemt->emtcxofs - oldofs;
                linrec = prsbalo(ctx, siz);
                memcpy(linrec, ctx->prscxemt->emtcxptr + oldofs,
                       (size_t)(ctx->prscxemt->emtcxofs - oldofs));
                
                /* now remove the OPCLINE - this isn't the place for it */
                ctx->prscxemt->emtcxofs = oldofs;

                /* allocate a token node to hold the line information */
                t2.tokofs = linrec - ctx->prscxpool;
                n4 = prsnew0(ctx, &t2);

                /* now build a four-way node with the line information */
                expr = prsxini(ctx);
                *inits = prsnew4(ctx, TOKTLOCAL, expr, prsnew0(ctx, t),
                                 *inits, n4);
            }
            else
            {
                expr = prsxini(ctx);               /* parse the initializer */
                *inits = prsnew3(ctx, TOKTLOCAL, expr,
                                 prsnew0(ctx, t), *inits);
            }
            (*inits)->prsnv.prsnvn[1]->prsnv.prsnvt.tokval = *locals;
        }

        /* if we don't have a comma, we're done */
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTCOMMA) break;
        toknext(ctx->prscxtok);                           /* skip the comma */
    }
    
    /* check for varargs specifier */
    if (varargs && ctx->prscxtok->tokcxcur.toktyp == TOKTELLIPSIS)
    {
        *varargs = TRUE;
        toknext(ctx->prscxtok);                        /* skip the ellipsis */
    }
    
    /* update the local table pool pointers to follow the table */
    ctx->prscxplcl = lcltab->toktlnxt;
    ctx->prscxslcl = lcltab->toktlsiz;
    
    return(lcltab);
}